

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O1

AffineSpace3ff * __thiscall
embree::SceneGraph::Transformations::interpolate
          (AffineSpace3ff *__return_storage_ptr__,Transformations *this,float gtime)

{
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar1;
  Vector *pVVar2;
  Vector *pVVar3;
  size_t sVar4;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar5;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar6;
  int iVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined8 uVar31;
  uint uVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  
  sVar4 = (this->spaces).size_active;
  if (sVar4 == 1) {
    pAVar5 = (this->spaces).items;
    uVar31 = *(undefined8 *)((long)&(pAVar5->l).vx.field_0 + 8);
    *(undefined8 *)&(__return_storage_ptr__->l).vx.field_0 = *(undefined8 *)&(pAVar5->l).vx.field_0;
    *(undefined8 *)((long)&(__return_storage_ptr__->l).vx.field_0 + 8) = uVar31;
    uVar31 = *(undefined8 *)((long)&(pAVar5->l).vy.field_0 + 8);
    *(undefined8 *)&(__return_storage_ptr__->l).vy.field_0 = *(undefined8 *)&(pAVar5->l).vy.field_0;
    *(undefined8 *)((long)&(__return_storage_ptr__->l).vy.field_0 + 8) = uVar31;
    uVar31 = *(undefined8 *)((long)&(pAVar5->l).vz.field_0 + 8);
    *(undefined8 *)&(__return_storage_ptr__->l).vz.field_0 = *(undefined8 *)&(pAVar5->l).vz.field_0;
    *(undefined8 *)((long)&(__return_storage_ptr__->l).vz.field_0 + 8) = uVar31;
    fVar33 = (pAVar5->p).field_0.m128[0];
    fVar35 = (pAVar5->p).field_0.m128[1];
    fVar36 = (pAVar5->p).field_0.m128[2];
    fVar37 = (pAVar5->p).field_0.m128[3];
  }
  else {
    iVar7 = (int)sVar4;
    fVar38 = (float)(iVar7 + -1) * gtime;
    fVar33 = floorf(fVar38);
    uVar32 = iVar7 - 2;
    if ((int)fVar33 < (int)uVar32) {
      uVar32 = (int)fVar33;
    }
    uVar8 = 0;
    if (0 < (int)uVar32) {
      uVar8 = uVar32;
    }
    fVar38 = fVar38 - (float)(int)uVar8;
    pAVar6 = (this->spaces).items;
    fVar34 = 1.0 - fVar38;
    pAVar1 = pAVar6 + (ulong)uVar8 + 1;
    fVar9 = (pAVar1->l).vx.field_0.m128[1];
    fVar10 = (pAVar1->l).vx.field_0.m128[2];
    fVar11 = (pAVar1->l).vx.field_0.m128[3];
    pAVar5 = pAVar6 + uVar8;
    fVar12 = (pAVar5->l).vx.field_0.m128[1];
    fVar13 = (pAVar5->l).vx.field_0.m128[2];
    fVar14 = (pAVar5->l).vx.field_0.m128[3];
    pVVar2 = &pAVar6[(ulong)uVar8 + 1].l.vy;
    fVar15 = (pVVar2->field_0).m128[0];
    fVar16 = (pVVar2->field_0).m128[1];
    fVar17 = (pVVar2->field_0).m128[2];
    fVar18 = (pVVar2->field_0).m128[3];
    pVVar2 = &pAVar6[uVar8].l.vy;
    fVar19 = (pVVar2->field_0).m128[0];
    fVar20 = (pVVar2->field_0).m128[1];
    fVar21 = (pVVar2->field_0).m128[2];
    fVar22 = (pVVar2->field_0).m128[3];
    pVVar2 = &pAVar6[(ulong)uVar8 + 1].l.vz;
    fVar23 = (pVVar2->field_0).m128[0];
    fVar24 = (pVVar2->field_0).m128[1];
    fVar25 = (pVVar2->field_0).m128[2];
    fVar26 = (pVVar2->field_0).m128[3];
    pVVar2 = &pAVar6[uVar8].l.vz;
    fVar27 = (pVVar2->field_0).m128[0];
    fVar28 = (pVVar2->field_0).m128[1];
    fVar29 = (pVVar2->field_0).m128[2];
    fVar30 = (pVVar2->field_0).m128[3];
    pVVar2 = &pAVar6[(ulong)uVar8 + 1].p;
    pVVar3 = &pAVar6[uVar8].p;
    fVar33 = fVar34 * (pVVar3->field_0).m128[0] + fVar38 * (pVVar2->field_0).m128[0];
    fVar35 = fVar34 * (pVVar3->field_0).m128[1] + fVar38 * (pVVar2->field_0).m128[1];
    fVar36 = fVar34 * (pVVar3->field_0).m128[2] + fVar38 * (pVVar2->field_0).m128[2];
    fVar37 = fVar34 * (pVVar3->field_0).m128[3] + fVar38 * (pVVar2->field_0).m128[3];
    (__return_storage_ptr__->l).vx.field_0.m128[0] =
         (pAVar5->l).vx.field_0.m128[0] * fVar34 + (pAVar1->l).vx.field_0.m128[0] * fVar38;
    (__return_storage_ptr__->l).vx.field_0.m128[1] = fVar12 * fVar34 + fVar9 * fVar38;
    (__return_storage_ptr__->l).vx.field_0.m128[2] = fVar13 * fVar34 + fVar10 * fVar38;
    (__return_storage_ptr__->l).vx.field_0.m128[3] = fVar14 * fVar34 + fVar11 * fVar38;
    (__return_storage_ptr__->l).vy.field_0.m128[0] = fVar19 * fVar34 + fVar15 * fVar38;
    (__return_storage_ptr__->l).vy.field_0.m128[1] = fVar20 * fVar34 + fVar16 * fVar38;
    (__return_storage_ptr__->l).vy.field_0.m128[2] = fVar21 * fVar34 + fVar17 * fVar38;
    (__return_storage_ptr__->l).vy.field_0.m128[3] = fVar22 * fVar34 + fVar18 * fVar38;
    (__return_storage_ptr__->l).vz.field_0.m128[0] = fVar27 * fVar34 + fVar23 * fVar38;
    (__return_storage_ptr__->l).vz.field_0.m128[1] = fVar28 * fVar34 + fVar24 * fVar38;
    (__return_storage_ptr__->l).vz.field_0.m128[2] = fVar29 * fVar34 + fVar25 * fVar38;
    (__return_storage_ptr__->l).vz.field_0.m128[3] = fVar30 * fVar34 + fVar26 * fVar38;
  }
  (__return_storage_ptr__->p).field_0.m128[0] = fVar33;
  (__return_storage_ptr__->p).field_0.m128[1] = fVar35;
  (__return_storage_ptr__->p).field_0.m128[2] = fVar36;
  (__return_storage_ptr__->p).field_0.m128[3] = fVar37;
  return __return_storage_ptr__;
}

Assistant:

AffineSpace3ff interpolate (const float gtime) const
      {
        assert(time_range.lower == 0.0f && time_range.upper == 1.0f);
        if (spaces.size() == 1) return spaces[0];

        /* calculate time segment itime and fractional time ftime */
        const int time_segments = int(spaces.size()-1);
        const float time = gtime*float(time_segments);
        const int itime = clamp(int(floor(time)),0,time_segments-1);
        const float ftime = time - float(itime);
        return lerp(spaces[itime+0],spaces[itime+1],ftime);
      }